

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall
wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this,WastParser *parser)

{
  WastParser *pWVar1;
  bool bVar2;
  int iVar3;
  Location local_c8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  Location local_68;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  WastParser *local_18;
  WastParser *parser_local;
  WastLexer *this_local;
  
  local_18 = parser;
  parser_local = (WastParser *)this;
  do {
    this->token_start_ = this->cursor_;
    iVar3 = PeekChar(this);
    switch(iVar3) {
    default:
      iVar3 = PeekChar(this);
      bVar2 = IsKeyword(iVar3);
      if (bVar2) {
        GetKeywordToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      iVar3 = PeekChar(this);
      bVar2 = IsReserved(iVar3);
      if (bVar2) {
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      ReadChar(this);
      pWVar1 = local_18;
      GetLocation(&local_c8,this);
      WastParser::Error(pWVar1,0x2dceba);
      break;
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      ReadWhitespace(this);
      break;
    case 0x22:
      GetStringToken(__return_storage_ptr__,this,local_18);
      return __return_storage_ptr__;
    case 0x24:
      GetIdToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      string_view::string_view(&local_28,"(;");
      bVar2 = MatchString(this,local_28);
      if (!bVar2) {
        string_view::string_view(&local_38,"(@");
        bVar2 = MatchString(this,local_38);
        if (!bVar2) {
          ReadChar(this);
          BareToken(__return_storage_ptr__,this,Lpar);
          return __return_storage_ptr__;
        }
        ReadReservedChars(this);
        TextToken(__return_storage_ptr__,this,LparAnn,2);
        return __return_storage_ptr__;
      }
      bVar2 = ReadBlockComment(this,local_18);
      if (!bVar2) {
        BareToken(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      break;
    case 0x29:
      ReadChar(this);
      BareToken(__return_storage_ptr__,this,Rpar);
      return __return_storage_ptr__;
    case 0x2b:
    case 0x2d:
      ReadChar(this);
      iVar3 = PeekChar(this);
      switch(iVar3) {
      case 0x30:
        goto switchD_002275b8_caseD_30;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        GetNumberToken(__return_storage_ptr__,this,Int);
        return __return_storage_ptr__;
      default:
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x69:
        GetInfToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x6e:
        GetNanToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    case 0x30:
      string_view::string_view(&local_88,"0x");
      bVar2 = MatchString(this,local_88);
      if (!bVar2) {
        GetNumberToken(__return_storage_ptr__,this,Last_Literal);
        return __return_storage_ptr__;
      }
      GetHexNumberToken(__return_storage_ptr__,this,Last_Literal);
      return __return_storage_ptr__;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      GetNumberToken(__return_storage_ptr__,this,Last_Literal);
      return __return_storage_ptr__;
    case 0x3b:
      string_view::string_view(&local_48,";;");
      bVar2 = MatchString(this,local_48);
      if (bVar2) {
        bVar2 = ReadLineComment(this);
        if (!bVar2) {
          BareToken(__return_storage_ptr__,this,Eof);
          return __return_storage_ptr__;
        }
      }
      else {
        ReadChar(this);
        pWVar1 = local_18;
        GetLocation(&local_68,this);
        WastParser::Error(pWVar1,0x2dceba);
      }
      break;
    case 0x61:
      string_view::string_view(&local_98,"align=");
      GetNameEqNumToken(__return_storage_ptr__,this,local_98,AlignEqNat);
      return __return_storage_ptr__;
    case 0x69:
      GetInfToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x6e:
      GetNanToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x6f:
      string_view::string_view(&local_a8,"offset=");
      GetNameEqNumToken(__return_storage_ptr__,this,local_a8,OffsetEqNat);
      return __return_storage_ptr__;
    case -1:
      BareToken(__return_storage_ptr__,this,Eof);
      return __return_storage_ptr__;
    }
  } while( true );
switchD_002275b8_caseD_30:
  string_view::string_view(&local_78,"0x");
  bVar2 = MatchString(this,local_78);
  if (!bVar2) {
    GetNumberToken(__return_storage_ptr__,this,Int);
    return __return_storage_ptr__;
  }
  GetHexNumberToken(__return_storage_ptr__,this,Int);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken(WastParser* parser) {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment(parser)) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          ReadReservedChars();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken(parser);

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsReserved(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}